

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman_tests.cpp
# Opt level: O1

void __thiscall addrman_tests::addrman_simple::test_method(addrman_simple *this)

{
  long lVar1;
  __single_object _Var2;
  bool bVar3;
  readonly_property<bool> rVar4;
  int32_t iVar5;
  int iVar6;
  __uniq_ptr_data<AddrMan,_std::default_delete<AddrMan>,_true,_true> _Var7;
  size_t sVar8;
  NodeContext *node_ctx;
  iterator in_R8;
  iterator pvVar9;
  iterator in_R9;
  iterator pvVar10;
  pointer __p;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  initializer_list<CAddress> __l;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  initializer_list<CAddress> __l_00;
  const_string file_05;
  const_string file_06;
  initializer_list<CAddress> __l_01;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  check_type cVar11;
  char *local_460;
  char *local_458;
  undefined1 *local_450;
  undefined1 *local_448;
  char *local_440;
  char *local_438;
  char *local_430;
  char *local_428;
  undefined1 *local_420;
  undefined1 *local_418;
  char *local_410;
  char *local_408;
  char *local_400;
  char *local_3f8;
  undefined1 *local_3f0;
  undefined1 *local_3e8;
  char *local_3e0;
  char *local_3d8;
  char *local_3d0;
  char *local_3c8;
  char *local_3c0 [2];
  vector<CAddress,_std::allocator<CAddress>_> local_3b0;
  NodeSeconds local_398;
  undefined1 *local_390;
  char *local_388;
  char *local_380;
  char local_374 [4];
  size_t local_370;
  undefined1 *local_368;
  undefined1 *local_360;
  char *local_358;
  char *local_350;
  char *local_348;
  char *local_340;
  undefined1 *local_338;
  undefined1 *local_330;
  char *local_328;
  char *local_320;
  undefined1 *local_318;
  undefined1 *local_310;
  char *local_308;
  char *local_300;
  undefined1 *local_2f8;
  undefined1 *local_2f0;
  char *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  undefined1 *local_2c8;
  undefined1 *local_2c0;
  char *local_2b8;
  char *local_2b0;
  undefined1 *local_2a8;
  undefined1 *local_2a0;
  char *local_298;
  char *local_290;
  undefined1 *local_288;
  undefined1 *local_280;
  char *local_278;
  char *local_270;
  __single_object addrman;
  undefined1 local_260 [8];
  vector<CAddress,_std::allocator<CAddress>_> vAddr;
  direct_or_indirect local_240;
  undefined4 local_230;
  Network local_228;
  uint32_t uStack_224;
  uint16_t local_220;
  CService addr2;
  direct_or_indirect local_1f0;
  uint local_1e0;
  Network local_1d8;
  uint32_t uStack_1d4;
  uint16_t local_1d0;
  undefined1 local_1c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_1b8;
  CService addr1_dup;
  __node_base_ptr local_178 [2];
  direct_or_indirect local_168;
  uint local_158;
  Network local_150;
  uint32_t uStack_14c;
  uint16_t local_148;
  CService addr1;
  CAddress addr_ret1;
  undefined **local_d8 [2];
  undefined1 *local_c8 [2];
  uint16_t local_b8;
  duration local_b0;
  ServiceFlags SStack_a8;
  CAddress addr_null;
  CNetAddr source;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  node_ctx = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_node;
  iVar5 = GetCheckRatio(node_ctx);
  _Var7.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
  super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
  super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl =
       (__uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>)operator_new(8);
  AddrMan::AddrMan((AddrMan *)
                   _Var7.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                   super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                   super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,&EMPTY_NETGROUPMAN,true,
                   iVar5);
  addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
  super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
  super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl =
       (__uniq_ptr_data<AddrMan,_std::default_delete<AddrMan>,_true,_true>)
       (__uniq_ptr_data<AddrMan,_std::default_delete<AddrMan>,_true,_true>)
       _Var7.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
       super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
       super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl;
  local_d8[0] = local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"252.2.2.2","");
  ResolveIP(&source,(string *)local_d8);
  if (local_d8[0] != local_c8) {
    operator_delete(local_d8[0],(ulong)((long)local_c8[0] + 1));
  }
  local_278 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_270 = "";
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  local_280 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x48;
  file.m_begin = (iterator)&local_278;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_288,msg);
  addr_ret1.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       addr_ret1.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  addr_ret1.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = "@;\x1f";
  addr_ret1.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  addr_ret1.super_CService.super_CNetAddr._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)AddrMan::Size((AddrMan *)
                                    addrman._M_t.
                                    super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>.
                                    _M_t.
                                    super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>
                                    .super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                                    (optional<Network>)0x0,(optional<bool>)0x0);
  local_1c8._0_8_ = &local_3b0;
  local_3b0.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)local_3b0.super__Vector_base<CAddress,_std::allocator<CAddress>_>.
                              _M_impl.super__Vector_impl_data._M_start._4_4_ << 0x20);
  addr1_dup.super_CNetAddr.m_addr._union.direct[0] =
       vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data
       ._M_start == (pointer)0x0;
  addr1_dup.super_CNetAddr.m_addr._union._8_8_ = 0;
  addr1_dup.super_CNetAddr.m_addr._size = 0;
  addr1_dup.super_CNetAddr.m_addr._20_4_ = 0;
  addr1.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  addr1.super_CNetAddr.m_addr._union._8_8_ =
       (long)
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
       + 0x66;
  local_c8[1] = (undefined1 *)&addr2;
  local_d8[1]._0_1_ = '\0';
  local_d8[0] = &PTR__lazy_ostream_013abb70;
  local_c8[0] = boost::unit_test::lazy_ostream::inst;
  addr_null.super_CService.super_CNetAddr._24_8_ = local_1c8;
  addr_null.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       addr_null.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  addr_null.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = "@;\x1f";
  addr_null.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  addr2.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)&vAddr;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&addr1_dup,(lazy_ostream *)&addr_ret1,1,2,REQUIRE,0xe52afd,
             (size_t)&addr1,0x48,(string *)local_d8,"0U",&addr_null);
  boost::detail::shared_count::~shared_count((shared_count *)&addr1_dup.super_CNetAddr.m_addr._size)
  ;
  addr_ret1.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)&addr_ret1.nServices;
  addr_ret1.super_CService.super_CNetAddr.m_addr._size = 0;
  addr_ret1.super_CService.super_CNetAddr.m_addr._20_4_ = 0;
  addr_ret1.super_CService.super_CNetAddr.m_net = NET_UNROUTABLE;
  addr_ret1.super_CService.super_CNetAddr.m_scope_id = 0;
  addr_ret1.super_CService.super_CNetAddr.m_addr._union._8_8_ = 1;
  addr_ret1.super_CService.port = 0;
  addr_ret1.super_CService._34_6_ = 0x3f80;
  addr_ret1.nTime.__d.__r = (duration)0;
  addr_ret1.nServices = NODE_NONE;
  AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                   *)local_d8,
                  (AddrMan *)
                  addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                  super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                  super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,false,
                  (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)&addr_ret1);
  addr_null.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       CONCAT71(local_d8[1]._1_7_,local_d8[1]._0_1_);
  addr_null.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)local_d8[0];
  addr_null.super_CService.super_CNetAddr.m_addr._size = local_c8[0]._0_4_;
  local_c8[0] = (undefined1 *)((ulong)local_c8[0] & 0xffffffff00000000);
  addr_null.super_CService.super_CNetAddr._24_8_ = local_c8[1];
  addr_null.super_CService.port = local_b8;
  addr_null.nTime.__d.__r = (duration)(duration)local_b0.__r;
  addr_null.nServices = SStack_a8;
  std::
  _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&addr_ret1);
  local_298 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_290 = "";
  local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x4a;
  file_00.m_begin = (iterator)&local_298;
  msg_00.m_end = pvVar10;
  msg_00.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_2a8,
             msg_00);
  addr1_dup.super_CNetAddr.m_addr._union._8_8_ =
       addr1_dup.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  addr1_dup.super_CNetAddr.m_addr._union.indirect_contents.indirect = "@;\x1f";
  addr1_dup.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  addr1_dup.super_CNetAddr._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  CService::ToStringAddrPort_abi_cxx11_((string *)&addr1,&addr_null.super_CService);
  iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&addr1,
                     "[::]:0");
  addr2.super_CNetAddr.m_addr._union.direct[0] = iVar6 == 0;
  addr2.super_CNetAddr.m_addr._union._8_8_ = 0;
  addr2.super_CNetAddr.m_addr._size = 0;
  addr2.super_CNetAddr.m_addr._20_4_ = 0;
  local_1c8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_1c8._8_8_ = "";
  local_d8[1]._0_1_ = '\0';
  local_d8[0] = &PTR__lazy_ostream_013abbf0;
  local_c8[0] = boost::unit_test::lazy_ostream::inst;
  local_3b0.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0xe52b2a;
  addr_ret1.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       addr_ret1.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  addr_ret1.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = "@;\x1f";
  addr_ret1.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  addr_ret1.super_CService.super_CNetAddr._24_8_ = &local_3b0;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&addr1;
  local_c8[1] = (undefined1 *)&vAddr;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&addr2,(lazy_ostream *)&addr1_dup,1,2,REQUIRE,0xe52b0d,
             (size_t)local_1c8,0x4a,
             (pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
              *)local_d8,"\"[::]:0\"",
             (_Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              *)&addr_ret1);
  boost::detail::shared_count::~shared_count((shared_count *)&addr2.super_CNetAddr.m_addr._size);
  if ((size_type *)addr1.super_CNetAddr.m_addr._union.indirect_contents.indirect !=
      &addr1.super_CNetAddr.m_addr._size) {
    operator_delete(addr1.super_CNetAddr.m_addr._union.indirect_contents.indirect,
                    CONCAT44(addr1.super_CNetAddr.m_addr._20_4_,addr1.super_CNetAddr.m_addr._size) +
                    1);
  }
  local_d8[0] = local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"250.1.1.1","");
  ResolveService(&addr1,(string *)local_d8,0x208d);
  if (local_d8[0] != local_c8) {
    operator_delete(local_d8[0],(ulong)((long)local_c8[0] + 1));
  }
  local_2b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_2b0 = "";
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x4e;
  file_01.m_begin = (iterator)&local_2b8;
  msg_01.m_end = pvVar10;
  msg_01.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_2c8,
             msg_01);
  _Var2 = addrman;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_168.indirect_contents,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr1);
  local_150 = addr1.super_CNetAddr.m_net;
  uStack_14c = addr1.super_CNetAddr.m_scope_id;
  local_148 = addr1.port;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_d8,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_168.indirect_contents);
  local_c8[1] = (undefined1 *)_local_150;
  local_b8 = local_148;
  local_b0.__r = 100000000;
  SStack_a8 = NODE_NONE;
  __l._M_len = 1;
  __l._M_array = (iterator)local_d8;
  std::vector<CAddress,_std::allocator<CAddress>_>::vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&addr2,__l,(allocator_type *)&vAddr);
  _cVar11 = 0x21e8a0;
  bVar3 = AddrMan::Add((AddrMan *)
                       _Var2._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t
                       .super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                       super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                       (vector<CAddress,_std::allocator<CAddress>_> *)&addr2,&source,(seconds)0x0);
  addr1_dup.super_CNetAddr.m_addr._union.direct[0] = bVar3;
  addr1_dup.super_CNetAddr.m_addr._union._8_8_ = 0;
  addr1_dup.super_CNetAddr.m_addr._size = 0;
  addr1_dup.super_CNetAddr.m_addr._20_4_ = 0;
  local_1c8._0_8_ = "addrman->Add({CAddress(addr1, NODE_NONE)}, source)";
  local_1c8._8_8_ = "";
  addr_ret1.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       addr_ret1.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  addr_ret1.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = "@;\x1f";
  addr_ret1.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_2d0 = "";
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x0;
  addr_ret1.super_CService.super_CNetAddr._24_8_ = local_1c8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&addr1_dup,(lazy_ostream *)&addr_ret1,1,0,WARN,_cVar11,
             (size_t)&local_2d8,0x4e);
  boost::detail::shared_count::~shared_count((shared_count *)&addr1_dup.super_CNetAddr.m_addr._size)
  ;
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&addr2);
  if (0x10 < (uint)local_c8[0]._0_4_) {
    free(local_d8[0]);
    local_d8[0] = (undefined1 **)0x0;
  }
  if (0x10 < local_158) {
    free(local_168.indirect_contents.indirect);
    local_168.indirect_contents.indirect = (char *)0x0;
  }
  local_2e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_2e0 = "";
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x4f;
  file_02.m_begin = (iterator)&local_2e8;
  msg_02.m_end = pvVar10;
  msg_02.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_2f8,
             msg_02);
  addr1_dup.super_CNetAddr.m_addr._union._8_8_ =
       addr1_dup.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  addr1_dup.super_CNetAddr.m_addr._union.indirect_contents.indirect = "@;\x1f";
  addr1_dup.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  addr1_dup.super_CNetAddr._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_3c0[0] = (char *)AddrMan::Size((AddrMan *)
                                       addrman._M_t.
                                       super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>
                                       .super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                                       (optional<Network>)0x0,(optional<bool>)0x0);
  local_3b0.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_260;
  local_260._0_4_ = 1;
  addr2.super_CNetAddr.m_addr._union.direct[0] = local_3c0[0] == (char *)0x1;
  addr2.super_CNetAddr.m_addr._union._8_8_ = 0;
  addr2.super_CNetAddr.m_addr._size = 0;
  addr2.super_CNetAddr.m_addr._20_4_ = 0;
  local_1c8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_1c8._8_8_ = "";
  local_d8[1]._0_1_ = '\0';
  local_d8[0] = &PTR__lazy_ostream_013abb70;
  local_c8[0] = boost::unit_test::lazy_ostream::inst;
  addr_ret1.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       addr_ret1.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  addr_ret1.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = "@;\x1f";
  addr_ret1.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  addr_ret1.super_CService.super_CNetAddr._24_8_ = &local_3b0;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_3c0;
  local_c8[1] = (allocator_type *)&vAddr;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&addr2,(lazy_ostream *)&addr1_dup,1,2,REQUIRE,0xe52afd,
             (size_t)local_1c8,0x4f,(iterator)local_d8,"1U",&addr_ret1);
  boost::detail::shared_count::~shared_count((shared_count *)&addr2.super_CNetAddr.m_addr._size);
  addr1_dup.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)local_178;
  addr1_dup.super_CNetAddr.m_addr._size = 0;
  addr1_dup.super_CNetAddr.m_addr._20_4_ = 0;
  addr1_dup.super_CNetAddr.m_net = NET_UNROUTABLE;
  addr1_dup.super_CNetAddr.m_scope_id = 0;
  addr1_dup.super_CNetAddr.m_addr._union._8_8_ = 1;
  addr1_dup.port = 0;
  addr1_dup._34_6_ = 0x3f80;
  local_178[0] = (__node_base_ptr)0x0;
  AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                   *)local_d8,
                  (AddrMan *)
                  addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                  super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                  super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,false,
                  (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)&addr1_dup);
  addr_ret1.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       CONCAT71(local_d8[1]._1_7_,local_d8[1]._0_1_);
  addr_ret1.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)local_d8[0];
  addr_ret1.super_CService.super_CNetAddr.m_addr._size = local_c8[0]._0_4_;
  local_c8[0] = (undefined1 *)((ulong)local_c8[0] & 0xffffffff00000000);
  addr_ret1.super_CService.super_CNetAddr._24_8_ = local_c8[1];
  addr_ret1.super_CService.port = local_b8;
  addr_ret1.nTime.__d.__r = (duration)(duration)local_b0.__r;
  addr_ret1.nServices = SStack_a8;
  std::
  _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&addr1_dup);
  local_308 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_300 = "";
  local_318 = &boost::unit_test::basic_cstring<char_const>::null;
  local_310 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x51;
  file_03.m_begin = (iterator)&local_308;
  msg_03.m_end = pvVar10;
  msg_03.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_318,
             msg_03);
  addr2.super_CNetAddr.m_addr._union._8_8_ =
       addr2.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  addr2.super_CNetAddr.m_addr._union.indirect_contents.indirect = "@;\x1f";
  addr2.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  addr2.super_CNetAddr._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  CService::ToStringAddrPort_abi_cxx11_((string *)local_1c8,&addr_ret1.super_CService);
  iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((string *)local_1c8,"250.1.1.1:8333");
  vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT71(vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl
                               .super__Vector_impl_data._M_start._1_7_,iVar6 == 0);
  vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_3b0.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0xe52a7d;
  local_3b0.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xe52ae3;
  local_d8[1]._0_1_ = '\0';
  local_d8[0] = &PTR__lazy_ostream_013abbf0;
  local_c8[0] = boost::unit_test::lazy_ostream::inst;
  local_260 = (undefined1  [8])0xe52b8b;
  addr1_dup.super_CNetAddr.m_addr._union._8_8_ =
       addr1_dup.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  addr1_dup.super_CNetAddr.m_addr._union.indirect_contents.indirect = "@;\x1f";
  addr1_dup.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  addr1_dup.super_CNetAddr._24_8_ = local_260;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  local_3c0[0] = (char *)local_1c8;
  local_c8[1] = (undefined1 *)local_3c0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&vAddr,(lazy_ostream *)&addr2,1,2,REQUIRE,0xe52b6e,
             (size_t)&local_3b0,0x51,
             (pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
              *)local_d8,"\"250.1.1.1:8333\"",
             (_Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              *)&addr1_dup);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._0_8_ != &aStack_1b8) {
    operator_delete((void *)local_1c8._0_8_,aStack_1b8._M_allocated_capacity + 1);
  }
  local_d8[0] = local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"250.1.1.1","");
  ResolveService(&addr1_dup,(string *)local_d8,0x208d);
  if (local_d8[0] != local_c8) {
    operator_delete(local_d8[0],(ulong)((long)local_c8[0] + 1));
  }
  local_328 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_320 = "";
  local_338 = &boost::unit_test::basic_cstring<char_const>::null;
  local_330 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x56;
  file_04.m_begin = (iterator)&local_328;
  msg_04.m_end = pvVar10;
  msg_04.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_338,
             msg_04);
  _Var2 = addrman;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_1f0.indirect_contents,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr1_dup);
  local_1d8 = addr1_dup.super_CNetAddr.m_net;
  uStack_1d4 = addr1_dup.super_CNetAddr.m_scope_id;
  local_1d0 = addr1_dup.port;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_d8,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_1f0.indirect_contents);
  local_c8[1] = (undefined1 *)_local_1d8;
  local_b8 = local_1d0;
  local_b0.__r = 100000000;
  SStack_a8 = NODE_NONE;
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)local_d8;
  std::vector<CAddress,_std::allocator<CAddress>_>::vector
            (&vAddr,__l_00,(allocator_type *)local_3c0);
  _cVar11 = 0x21eebc;
  bVar3 = AddrMan::Add((AddrMan *)
                       _Var2._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t
                       .super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                       super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,&vAddr,&source,
                       (seconds)0x0);
  local_1c8[0] = (class_property<bool>)(class_property<bool>)!bVar3;
  local_1c8._8_8_ = (element_type *)0x0;
  aStack_1b8._M_allocated_capacity = 0;
  local_3b0.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0xe52bab;
  local_3b0.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xe52be2;
  addr2.super_CNetAddr.m_addr._union._8_8_ =
       addr2.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  addr2.super_CNetAddr.m_addr._union.indirect_contents.indirect = "@;\x1f";
  addr2.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_348 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_340 = "";
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x0;
  addr2.super_CNetAddr._24_8_ = &local_3b0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1c8,(lazy_ostream *)&addr2,1,0,WARN,_cVar11,
             (size_t)&local_348,0x56);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_1b8._M_allocated_capacity);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector(&vAddr);
  if (0x10 < (uint)local_c8[0]._0_4_) {
    free(local_d8[0]);
    local_d8[0] = (undefined1 **)0x0;
  }
  if (0x10 < local_1e0) {
    free(local_1f0.indirect_contents.indirect);
    local_1f0.indirect_contents.indirect = (char *)0x0;
  }
  local_358 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_350 = "";
  local_368 = &boost::unit_test::basic_cstring<char_const>::null;
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x57;
  file_05.m_begin = (iterator)&local_358;
  msg_05.m_end = pvVar10;
  msg_05.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_368,
             msg_05);
  local_1c8._8_8_ = local_1c8._8_8_ & 0xffffffffffffff00;
  local_1c8._0_8_ = &PTR__lazy_ostream_013abb30;
  aStack_1b8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_1b8._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_370 = AddrMan::Size((AddrMan *)
                            addrman._M_t.
                            super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                            super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                            super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                            (optional<Network>)0x0,(optional<bool>)0x0);
  local_3c0[0] = (char *)&local_370;
  local_260 = (undefined1  [8])local_374;
  local_374[0] = '\x01';
  local_374[1] = '\0';
  local_374[2] = '\0';
  local_374[3] = '\0';
  vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT71(vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl
                               .super__Vector_impl_data._M_start._1_7_,local_370 == 1);
  vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_3b0.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0xe52a7d;
  local_3b0.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xe52ae3;
  local_d8[1]._0_1_ = '\0';
  local_d8[0] = &PTR__lazy_ostream_013abb70;
  local_c8[0] = boost::unit_test::lazy_ostream::inst;
  addr2.super_CNetAddr.m_addr._union._8_8_ =
       addr2.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  addr2.super_CNetAddr.m_addr._union.indirect_contents.indirect = "@;\x1f";
  addr2.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  addr2.super_CNetAddr._24_8_ = local_260;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  local_c8[1] = (allocator_type *)local_3c0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&vAddr,(lazy_ostream *)local_1c8,1,2,REQUIRE,0xe52afd,
             (size_t)&local_3b0,0x57,(iterator)local_d8,"1U",&addr2);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_d8[0] = local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"250.1.1.2","");
  ResolveService(&addr2,(string *)local_d8,0x208d);
  if (local_d8[0] != local_c8) {
    operator_delete(local_d8[0],(ulong)((long)local_c8[0] + 1));
  }
  local_388 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_380 = "";
  local_398.__d.__r = (duration)&boost::unit_test::basic_cstring<char_const>::null;
  local_390 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x61;
  file_06.m_begin = (iterator)&local_388;
  msg_06.m_end = pvVar10;
  msg_06.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_398,
             msg_06);
  _Var2 = addrman;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_240.indirect_contents,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr2);
  local_228 = addr2.super_CNetAddr.m_net;
  uStack_224 = addr2.super_CNetAddr.m_scope_id;
  local_220 = addr2.port;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_d8,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_240.indirect_contents);
  local_c8[1] = (undefined1 *)_local_228;
  local_b8 = local_220;
  local_b0.__r = 100000000;
  SStack_a8 = NODE_NONE;
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)local_d8;
  std::vector<CAddress,_std::allocator<CAddress>_>::vector
            (&local_3b0,__l_01,(allocator_type *)local_260);
  _cVar11 = 0x21f253;
  bVar3 = AddrMan::Add((AddrMan *)
                       _Var2._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t
                       .super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                       super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,&local_3b0,&source,
                       (seconds)0x0);
  vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT71(vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl
                               .super__Vector_impl_data._M_start._1_7_,bVar3);
  vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_3c0[0] = "addrman->Add({CAddress(addr2, NODE_NONE)}, source)";
  local_3c0[1] = (char *)((long)"addrman->Add({CAddress(addr2, NODE_NONE)}, source)" + 0x32);
  local_1c8._8_8_ = local_1c8._8_8_ & 0xffffffffffffff00;
  local_1c8._0_8_ = &PTR__lazy_ostream_013abc70;
  aStack_1b8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_3d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_3c8 = "";
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x0;
  aStack_1b8._8_8_ = (allocator_type *)local_3c0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&vAddr,(lazy_ostream *)local_1c8,1,0,WARN,_cVar11,
             (size_t)&local_3d0,0x61);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector(&local_3b0);
  if (0x10 < (uint)local_c8[0]._0_4_) {
    free(local_d8[0]);
    local_d8[0] = (undefined1 **)0x0;
  }
  if (0x10 < (uint)local_230) {
    free(local_240.indirect_contents.indirect);
    local_240.indirect_contents.indirect = (char *)0x0;
  }
  local_3e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_3d8 = "";
  local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x62;
  file_07.m_begin = (iterator)&local_3e0;
  msg_07.m_end = pvVar10;
  msg_07.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_3f0,
             msg_07);
  _cVar11 = 0x21f37e;
  sVar8 = AddrMan::Size((AddrMan *)
                        addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>.
                        _M_t.super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                        super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,(optional<Network>)0x0,
                        (optional<bool>)0x0);
  local_1c8[0] = (class_property<bool>)(class_property<bool>)(sVar8 != 0);
  local_1c8._8_8_ = (element_type *)0x0;
  aStack_1b8._M_allocated_capacity = 0;
  vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)anon_var_dwarf_1a34ec;
  vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xe52c34;
  local_d8[1]._0_1_ = '\0';
  local_d8[0] = &PTR__lazy_ostream_013abc70;
  local_c8[0] = boost::unit_test::lazy_ostream::inst;
  local_400 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_3f8 = "";
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x0;
  local_c8[1] = (undefined1 *)&vAddr;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1c8,(lazy_ostream *)local_d8,1,0,WARN,_cVar11,
             (size_t)&local_400,0x62);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_1b8._M_allocated_capacity);
  iVar5 = GetCheckRatio(node_ctx);
  _Var7.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
  super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
  super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl =
       (__uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>)operator_new(8);
  AddrMan::AddrMan((AddrMan *)
                   _Var7.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                   super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                   super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,&EMPTY_NETGROUPMAN,true,
                   iVar5);
  _Var2 = addrman;
  local_d8[0] = (undefined **)0x0;
  bVar3 = (__uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>)
          addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
          super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
          super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>)0x0;
  addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
  super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
  super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl =
       (__uniq_ptr_data<AddrMan,_std::default_delete<AddrMan>,_true,_true>)
       (__uniq_ptr_data<AddrMan,_std::default_delete<AddrMan>,_true,_true>)
       _Var7.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
       super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
       super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl;
  if (bVar3) {
    AddrMan::~AddrMan((AddrMan *)
                      _Var2._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                      super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                      super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl);
    operator_delete((void *)_Var2._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>
                            ._M_t.super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                            super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,8);
  }
  std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::~unique_ptr
            ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)local_d8);
  vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_1c8._0_8_ = &aStack_1b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"250.1.1.3","");
  ResolveService((CService *)local_d8,(string *)local_1c8,0x208d);
  local_3b0.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  std::vector<CAddress,std::allocator<CAddress>>::emplace_back<CService,ServiceFlags>
            ((vector<CAddress,std::allocator<CAddress>> *)&vAddr,(CService *)local_d8,
             (ServiceFlags *)&local_3b0);
  if (0x10 < (uint)local_c8[0]._0_4_) {
    free(local_d8[0]);
    local_d8[0] = (undefined **)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._0_8_ != &aStack_1b8) {
    operator_delete((void *)local_1c8._0_8_,aStack_1b8._M_allocated_capacity + 1);
  }
  local_1c8._0_8_ = &aStack_1b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"250.1.1.4","");
  ResolveService((CService *)local_d8,(string *)local_1c8,0x208d);
  local_3b0.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  std::vector<CAddress,std::allocator<CAddress>>::emplace_back<CService,ServiceFlags>
            ((vector<CAddress,std::allocator<CAddress>> *)&vAddr,(CService *)local_d8,
             (ServiceFlags *)&local_3b0);
  if (0x10 < (uint)local_c8[0]._0_4_) {
    free(local_d8[0]);
    local_d8[0] = (undefined **)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._0_8_ != &aStack_1b8) {
    operator_delete((void *)local_1c8._0_8_,aStack_1b8._M_allocated_capacity + 1);
  }
  local_410 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_408 = "";
  local_420 = &boost::unit_test::basic_cstring<char_const>::null;
  local_418 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x69;
  file_08.m_begin = (iterator)&local_410;
  msg_08.m_end = pvVar10;
  msg_08.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_420,
             msg_08);
  _cVar11 = 0x21f631;
  rVar4.super_class_property<bool>.value =
       (class_property<bool>)
       AddrMan::Add((AddrMan *)
                    addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                    super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                    super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,&vAddr,&source,(seconds)0x0
                   );
  local_1c8._8_8_ = (element_type *)0x0;
  aStack_1b8._M_allocated_capacity = 0;
  local_3b0.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0xe52c49;
  local_3b0.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xe52c64;
  local_d8[1]._0_1_ = '\0';
  local_d8[0] = &PTR__lazy_ostream_013abc70;
  local_c8[0] = boost::unit_test::lazy_ostream::inst;
  local_430 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_428 = "";
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x0;
  local_c8[1] = (undefined1 *)&local_3b0;
  local_1c8[0] = rVar4.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1c8,(lazy_ostream *)local_d8,1,0,WARN,_cVar11,
             (size_t)&local_430,0x69);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_1b8._M_allocated_capacity);
  local_440 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_438 = "";
  local_450 = &boost::unit_test::basic_cstring<char_const>::null;
  local_448 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x6a;
  file_09.m_begin = (iterator)&local_440;
  msg_09.m_end = pvVar10;
  msg_09.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_450,
             msg_09);
  _cVar11 = 0x21f6fe;
  sVar8 = AddrMan::Size((AddrMan *)
                        addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>.
                        _M_t.super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                        super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,(optional<Network>)0x0,
                        (optional<bool>)0x0);
  local_1c8[0] = (class_property<bool>)(class_property<bool>)(sVar8 != 0);
  local_1c8._8_8_ = (element_type *)0x0;
  aStack_1b8._M_allocated_capacity = 0;
  local_3b0.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0xe52c20;
  local_3b0.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xe52c34;
  local_d8[1]._0_1_ = '\0';
  local_d8[0] = &PTR__lazy_ostream_013abc70;
  local_c8[0] = boost::unit_test::lazy_ostream::inst;
  local_460 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_458 = "";
  local_c8[1] = (undefined1 *)&local_3b0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1c8,(lazy_ostream *)local_d8,1,0,WARN,_cVar11,
             (size_t)&local_460,0x6a);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_1b8._M_allocated_capacity);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector(&vAddr);
  if (0x10 < addr2.super_CNetAddr.m_addr._size) {
    free(addr2.super_CNetAddr.m_addr._union.indirect_contents.indirect);
    addr2.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < addr1_dup.super_CNetAddr.m_addr._size) {
    free(addr1_dup.super_CNetAddr.m_addr._union.indirect_contents.indirect);
    addr1_dup.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < addr_ret1.super_CService.super_CNetAddr.m_addr._size) {
    free(addr_ret1.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect);
    addr_ret1.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < addr1.super_CNetAddr.m_addr._size) {
    free(addr1.super_CNetAddr.m_addr._union.indirect_contents.indirect);
    addr1.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < addr_null.super_CService.super_CNetAddr.m_addr._size) {
    free(addr_null.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect);
    addr_null.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < source.m_addr._size) {
    free(source.m_addr._union.indirect_contents.indirect);
    source.m_addr._union.indirect_contents.indirect = (char *)0x0;
  }
  std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::~unique_ptr(&addrman);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(addrman_simple)
{
    auto addrman = std::make_unique<AddrMan>(EMPTY_NETGROUPMAN, DETERMINISTIC, GetCheckRatio(m_node));

    CNetAddr source = ResolveIP("252.2.2.2");

    // Test: Does Addrman respond correctly when empty.
    BOOST_CHECK_EQUAL(addrman->Size(), 0U);
    auto addr_null = addrman->Select().first;
    BOOST_CHECK_EQUAL(addr_null.ToStringAddrPort(), "[::]:0");

    // Test: Does Addrman::Add work as expected.
    CService addr1 = ResolveService("250.1.1.1", 8333);
    BOOST_CHECK(addrman->Add({CAddress(addr1, NODE_NONE)}, source));
    BOOST_CHECK_EQUAL(addrman->Size(), 1U);
    auto addr_ret1 = addrman->Select().first;
    BOOST_CHECK_EQUAL(addr_ret1.ToStringAddrPort(), "250.1.1.1:8333");

    // Test: Does IP address deduplication work correctly.
    //  Expected dup IP should not be added.
    CService addr1_dup = ResolveService("250.1.1.1", 8333);
    BOOST_CHECK(!addrman->Add({CAddress(addr1_dup, NODE_NONE)}, source));
    BOOST_CHECK_EQUAL(addrman->Size(), 1U);


    // Test: New table has one addr and we add a diff addr we should
    //  have at least one addr.
    // Note that addrman's size cannot be tested reliably after insertion, as
    // hash collisions may occur. But we can always be sure of at least one
    // success.

    CService addr2 = ResolveService("250.1.1.2", 8333);
    BOOST_CHECK(addrman->Add({CAddress(addr2, NODE_NONE)}, source));
    BOOST_CHECK(addrman->Size() >= 1);

    // Test: reset addrman and test AddrMan::Add multiple addresses works as expected
    addrman = std::make_unique<AddrMan>(EMPTY_NETGROUPMAN, DETERMINISTIC, GetCheckRatio(m_node));
    std::vector<CAddress> vAddr;
    vAddr.emplace_back(ResolveService("250.1.1.3", 8333), NODE_NONE);
    vAddr.emplace_back(ResolveService("250.1.1.4", 8333), NODE_NONE);
    BOOST_CHECK(addrman->Add(vAddr, source));
    BOOST_CHECK(addrman->Size() >= 1);
}